

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O0

void __thiscall BoxNesting::Box::Box(Box *this,array<float,_3UL> *sideLengths)

{
  ostream *poVar1;
  invalid_argument *this_00;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  stringstream ss;
  value_type_conflict1 l;
  iterator __end1;
  iterator __begin1;
  array<float,_3UL> *__range1;
  float *in_stack_fffffffffffffde8;
  float *in_stack_fffffffffffffdf0;
  string local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [380];
  float local_2c;
  iterator local_28;
  float *local_20;
  undefined8 *local_18;
  
  *in_RDI = &PTR__Box_0014fa30;
  in_RDI[1] = *in_RSI;
  *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(in_RSI + 1);
  std::array<float,_3UL>::begin((array<float,_3UL> *)0x107570);
  std::array<float,_3UL>::end((array<float,_3UL> *)0x107583);
  std::sort<float*>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_18 = in_RDI + 1;
  local_20 = std::array<float,_3UL>::begin((array<float,_3UL> *)0x1075ae);
  local_28 = std::array<float,_3UL>::end((array<float,_3UL> *)0x1075c3);
  while( true ) {
    if (local_20 == local_28) {
      return;
    }
    local_2c = *local_20;
    if ((local_2c <= 0.5) || (1.0 <= local_2c)) break;
    local_20 = local_20 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"Length of a side of a box is not between allowed range: (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0.5);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1.0);
  std::operator<<(poVar1,")");
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_1e8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Box::Box(const std::array<float, 3>& sideLengths) : sideLengths(sideLengths)
{
	// Sice we only care whether a box can nest inside another box
	// We can optimize this check by always just sorting the lengths
	// so we don't have to check the permutations of the sidelengths
	std::sort(this->sideLengths.begin(), this->sideLengths.end());

	for (auto l : this->sideLengths) {
		if (l <= Box::minLength || l >= Box::maxLength) {
			std::stringstream ss;
			ss << "Length of a side of a box is not between allowed range: (" << Box::minLength << "," << Box::maxLength
			   << ")";
			throw std::invalid_argument(ss.str());
		}
	}
}